

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmReturn(ExpressionContext *ctx,VmModule *module,ExprReturn *node)

{
  VmValue *pVVar1;
  VmInstruction *value;
  VmInstructionType cmd;
  VmValue *in_stack_ffffffffffffffd8;
  
  pVVar1 = CompileVm(ctx,module,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  cmd = (VmInstructionType)pVVar1;
  if (node->value->type == ctx->typeVoid) {
    cmd = VM_INST_LOAD_BYTE;
  }
  value = anon_unknown.dwarf_13465d::CreateInstruction
                    ((anon_unknown_dwarf_13465d *)module,(VmModule *)(node->super_ExprBase).source,
                     (SynBase *)0x0,(VmType)(ZEXT816(0x20) << 0x40),cmd,(VmValue *)0x0,
                     (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffffd8);
  pVVar1 = anon_unknown.dwarf_13465d::CheckType(ctx,&node->super_ExprBase,&value->super_VmValue);
  return pVVar1;
}

Assistant:

VmValue* CompileVmReturn(ExpressionContext &ctx, VmModule *module, ExprReturn *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	if(node->coroutineStateUpdate)
		CompileVm(ctx, module, node->coroutineStateUpdate);

	if(node->closures)
		CompileVm(ctx, module, node->closures);

	if(node->value->type == ctx.typeVoid)
		return CheckType(ctx, node, CreateReturn(module, node->source));

	return CheckType(ctx, node, CreateReturn(module, node->source, value));
}